

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O0

void uiFree(Windows *win)

{
  Windows *win_local;
  
  if (_stdscr != 0) {
    if (win->header != (WINDOW *)0x0) {
      delwin(win->header);
    }
    if (win->body != (WINDOW *)0x0) {
      delwin(win->body);
    }
    if (win->footer != (WINDOW *)0x0) {
      delwin(win->footer);
    }
    if (win->menu != (WINDOW *)0x0) {
      delwin(win->menu);
    }
    endwin();
  }
  return;
}

Assistant:

void uiFree(struct Windows *win) {
    if (stdscr) {
        if (win->header) delwin(win->header);
        if (win->body) delwin(win->body);
        if (win->footer) delwin(win->footer);
        if (win->menu) delwin(win->menu);
        endwin();
    }
}